

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::PlayBounceSound(AActor *this,bool onfloor)

{
  int iVar1;
  FSoundID *sound_id;
  undefined7 in_register_00000031;
  FSoundID local_c [3];
  
  if ((((int)CONCAT71(in_register_00000031,onfloor) != 0) ||
      (((this->BounceFlags).Value & 0x100) == 0)) && ((*(uint *)&this->BounceFlags >> 9 & 1) == 0))
  {
    if ((char)*(uint *)&this->BounceFlags < '\0') {
      iVar1 = (this->SeeSound).super_FSoundID.ID;
      sound_id = local_c + 2;
    }
    else if ((onfloor) || (iVar1 = (this->WallBounceSound).super_FSoundID.ID, iVar1 < 1)) {
      iVar1 = (this->BounceSound).super_FSoundID.ID;
      sound_id = local_c + 1;
    }
    else {
      sound_id = local_c;
    }
    sound_id->ID = iVar1;
    S_Sound(this,2,sound_id,1.0,1.001);
  }
  return;
}

Assistant:

void AActor::PlayBounceSound(bool onfloor)
{
	if (!onfloor && (BounceFlags & BOUNCE_NoWallSound))
	{
		return;
	}

	if (!(BounceFlags & BOUNCE_Quiet))
	{
		if (BounceFlags & BOUNCE_UseSeeSound)
		{
			S_Sound (this, CHAN_VOICE, SeeSound, 1, ATTN_IDLE);
		}
		else if (onfloor || WallBounceSound <= 0)
		{
			S_Sound (this, CHAN_VOICE, BounceSound, 1, ATTN_IDLE);
		}
		else
		{
			S_Sound (this, CHAN_VOICE, WallBounceSound, 1, ATTN_IDLE);
		}
	}
}